

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

void __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::
update_current(boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *this,size_t pos)

{
  mapping_type *pmVar1;
  element_type *peVar2;
  size_t sVar3;
  pointer pbVar4;
  _List_node_base *p_Var5;
  long lVar6;
  difference_type __d;
  pointer pbVar7;
  size_t sVar8;
  
  pmVar1 = this->map_;
  peVar2 = (pmVar1->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar6 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  pbVar7 = (peVar2->
           super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  sVar8 = (long)pbVar7 - lVar6 >> 4;
  pbVar7 = pbVar7 + -1;
  pbVar4 = (pointer)(lVar6 + pos * 0x10);
  if (sVar8 == pos) {
    pbVar4 = pbVar7;
  }
  sVar3 = pbVar4->offset;
  p_Var5 = (this->value_).iterator_._M_node;
  pbVar4 = (pointer)(this->current_ * 0x10 + lVar6);
  if (sVar8 == this->current_) {
    pbVar4 = pbVar7;
  }
  sVar8 = pbVar4->offset;
  if (sVar3 == sVar8 || (long)(sVar3 - sVar8) < 0) {
    if (sVar3 != sVar8) {
      lVar6 = sVar8 - sVar3;
      do {
        p_Var5 = p_Var5->_M_prev;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
  }
  else {
    lVar6 = sVar8 - sVar3;
    do {
      p_Var5 = p_Var5->_M_next;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0);
  }
  this->current_ = pos;
  (this->value_).iterator_._M_node = p_Var5;
  peVar2 = (pmVar1->index_).
           super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  lVar6 = (long)(peVar2->
                super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(peVar2->
            super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
            )._M_impl.super__Vector_impl_data._M_finish - lVar6 >> 4 != pos) {
    (this->value_).rule_ = *(rule_type *)(lVar6 + 8 + pos * 0x10);
  }
  return;
}

Assistant:

index_type const &index() const
                    {
                        return map_->index();
                    }